

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O2

void __thiscall
wabt::interp::RefPtr<wabt::interp::Module>::RefPtr
          (RefPtr<wabt::interp::Module> *this,Store *store,Ref ref)

{
  FILE *__stream;
  bool bVar1;
  Index IVar2;
  Object **ppOVar3;
  char *pcVar4;
  ObjectKind kind;
  
  bVar1 = Store::Is<wabt::interp::Module>(store,ref);
  if (bVar1) {
    IVar2 = Store::NewRoot(store,ref);
    this->root_index_ = IVar2;
    ppOVar3 = FreeList<wabt::interp::Object_*>::Get(&store->objects_,ref.index);
    this->obj_ = (Module *)*ppOVar3;
    this->store_ = store;
    return;
  }
  kind = First;
  if (ref.index != 0) {
    ppOVar3 = FreeList<wabt::interp::Object_*>::Get(&store->objects_,ref.index);
    kind = (*ppOVar3)->kind_;
  }
  __stream = _stderr;
  pcVar4 = GetName(kind);
  fprintf(__stream,"Invalid conversion from Ref (%s) to RefPtr<%s>!\n",pcVar4,"Module");
  abort();
}

Assistant:

RefPtr<T>::RefPtr(Store& store, Ref ref) {
#ifndef NDEBUG
  if (!store.Is<T>(ref)) {
    ObjectKind ref_kind;
    if (ref == Ref::Null) {
      ref_kind = ObjectKind::Null;
    } else {
      ref_kind = store.objects_.Get(ref.index)->kind();
    }
    fprintf(stderr, "Invalid conversion from Ref (%s) to RefPtr<%s>!\n",
            GetName(ref_kind), T::GetTypeName());
    abort();
  }
#endif
  root_index_ = store.NewRoot(ref);
  obj_ = static_cast<T*>(store.objects_.Get(ref.index));
  store_ = &store;
}